

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  ulong uVar4;
  pointer pcVar5;
  impl_string_type *piVar6;
  size_type sVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  error_category *peVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_type sVar13;
  int *piVar14;
  path *ppVar15;
  path *extraout_RAX;
  bool bVar16;
  path local_220;
  error_code *local_200;
  char *local_1f8;
  long local_1f0;
  char local_1e8 [20];
  uint local_1d4;
  path work;
  ulong local_1a0;
  file_status fs;
  path pe;
  path local_170;
  iterator __begin3;
  path target;
  iterator __end3;
  
  uVar10 = (p->_path)._M_string_length;
  if (uVar10 == 0) {
    peVar11 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar11;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if ((((uVar10 < 3) || (pcVar3 = (p->_path)._M_dataplus._M_p, *pcVar3 != '/')) ||
      (pcVar3[1] != '/')) || ((pcVar3[2] == 0x2f || (iVar8 = isprint((int)pcVar3[2]), iVar8 == 0))))
  {
    uVar10 = 0;
  }
  else {
    uVar10 = std::__cxx11::string::find((char)p,0x2f);
    if (uVar10 == 0xffffffffffffffff) {
      uVar10 = (p->_path)._M_string_length;
    }
  }
  uVar4 = (p->_path)._M_string_length;
  if ((uVar10 < uVar4) && ((p->_path)._M_dataplus._M_p[uVar10] == '/')) {
    work._path._M_dataplus._M_p = (pointer)&work._path.field_2;
    pcVar5 = (p->_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&work,pcVar5,pcVar5 + uVar4);
  }
  else {
    absolute(&work,p,ec);
  }
  local_220._path._M_dataplus._M_p = (pointer)((long)&local_220 + 0x10);
  local_220._path._M_string_length = 0;
  local_220._path.field_2._M_local_buf[0] = '\0';
  detail::status_ex((path *)&fs,(error_code *)&work,(file_status *)ec,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,0);
  if (ec->_M_value == 0) {
    if (fs._type != not_found) {
      paVar12 = &pe._path.field_2;
      paVar1 = &(__return_storage_ptr__->_path).field_2;
      local_200 = ec;
      do {
        if ((((work._path._M_string_length < 3) || (*work._path._M_dataplus._M_p != '/')) ||
            (work._path._M_dataplus._M_p[1] != '/')) ||
           ((work._path._M_dataplus._M_p[2] == 0x2f ||
            (iVar8 = isprint((int)work._path._M_dataplus._M_p[2]), iVar8 == 0)))) {
          sVar13 = 0;
        }
        else {
          sVar13 = std::__cxx11::string::find((char)&work,0x2f);
          if (sVar13 == 0xffffffffffffffff) {
            sVar13 = work._path._M_string_length;
          }
        }
        if (((work._path._M_string_length < 3) || (*work._path._M_dataplus._M_p != '/')) ||
           ((work._path._M_dataplus._M_p[1] != '/' ||
            ((work._path._M_dataplus._M_p[2] == 0x2f ||
             (iVar8 = isprint((int)work._path._M_dataplus._M_p[2]), iVar8 == 0)))))) {
          uVar10 = 0;
        }
        else {
          uVar10 = std::__cxx11::string::find((char)&work,0x2f);
          if (uVar10 == 0xffffffffffffffff) {
            uVar10 = work._path._M_string_length;
          }
        }
        if (uVar10 < work._path._M_string_length) {
          local_1a0 = (ulong)(work._path._M_dataplus._M_p[uVar10] == '/');
        }
        else {
          local_1a0 = 0;
        }
        local_220._path._M_string_length = 0;
        *local_220._path._M_dataplus._M_p = '\0';
        target._path._M_dataplus = work._path._M_dataplus;
        path::iterator::iterator(&__begin3,&work,(const_iterator *)&target);
        target._path._M_dataplus._M_p = work._path._M_dataplus._M_p + work._path._M_string_length;
        path::iterator::iterator(&__end3,&work,(const_iterator *)&target);
        local_1d4 = 0;
        while (__begin3._iter._M_current != __end3._iter._M_current) {
          pe._path._M_dataplus._M_p = (pointer)paVar12;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pe,__begin3._current._path._M_dataplus._M_p,
                     __begin3._current._path._M_dataplus._M_p +
                     __begin3._current._path._M_string_length);
          if (pe._path._M_string_length == 0) {
            bVar16 = true;
          }
          else {
            path::path<char[2],ghc::filesystem::path>(&local_170,(char (*) [2])0x146071,auto_format)
            ;
            iVar8 = path::compare(&pe,&local_170);
            bVar16 = iVar8 == 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._path._M_dataplus._M_p != &local_170._path.field_2) {
              operator_delete(local_170._path._M_dataplus._M_p);
            }
          }
          iVar8 = 5;
          if (!bVar16) {
            path::path<char[3],ghc::filesystem::path>(&target,(char (*) [3])"..",auto_format);
            paVar2 = &target._path.field_2;
            iVar9 = path::compare(&pe,&target);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)target._path._M_dataplus._M_p != paVar2) {
              operator_delete(target._path._M_dataplus._M_p);
            }
            if (iVar9 == 0) {
              path::parent_path(&target,&local_220);
              std::__cxx11::string::operator=((string *)&local_220,(string *)&target);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)target._path._M_dataplus._M_p != paVar2) {
                operator_delete(target._path._M_dataplus._M_p);
              }
            }
            else {
              local_1f8 = local_1e8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1f8,local_220._path._M_dataplus._M_p,
                         local_220._path._M_dataplus._M_p + local_220._path._M_string_length);
              path::operator/=((path *)&local_1f8,&pe);
              target._path._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&target,local_1f8,local_1f8 + local_1f0);
              sVar7 = target._path._M_string_length;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)target._path._M_dataplus._M_p != paVar2) {
                operator_delete(target._path._M_dataplus._M_p);
              }
              if (local_1f8 != local_1e8) {
                operator_delete(local_1f8);
              }
              if (local_1a0 + sVar13 < sVar7) {
                local_1f8 = local_1e8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1f8,local_220._path._M_dataplus._M_p,
                           local_220._path._M_dataplus._M_p + local_220._path._M_string_length);
                path::operator/=((path *)&local_1f8,&pe);
                iVar8 = lstat(local_1f8,(stat *)&target);
                if (iVar8 == 0) {
                  peVar11 = (error_category *)std::_V2::system_category();
                  local_200->_M_value = 0;
                  local_200->_M_cat = peVar11;
                  bVar16 = (target._path.field_2._8_4_ & 0xf000) == 0xa000;
                }
                else {
                  piVar14 = __errno_location();
                  iVar8 = *piVar14;
                  peVar11 = (error_category *)std::_V2::system_category();
                  local_200->_M_value = iVar8;
                  local_200->_M_cat = peVar11;
                  bVar16 = false;
                }
                if (local_1f8 != local_1e8) {
                  operator_delete(local_1f8);
                }
                if (local_200->_M_value == 0) {
                  if (bVar16) {
                    local_1f8 = local_1e8;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1f8,local_220._path._M_dataplus._M_p,
                               local_220._path._M_dataplus._M_p + local_220._path._M_string_length);
                    path::operator/=((path *)&local_1f8,&pe);
                    read_symlink(&target,(path *)&local_1f8,local_200);
                    if (local_1f8 != local_1e8) {
                      operator_delete(local_1f8);
                    }
                    if (local_200->_M_value == 0) {
                      if (((target._path._M_string_length < 3) ||
                          (*target._path._M_dataplus._M_p != '/')) ||
                         (target._path._M_dataplus._M_p[1] != '/')) {
                        uVar10 = 0;
                      }
                      else if ((target._path._M_dataplus._M_p[2] == 0x2f) ||
                              (iVar8 = isprint((int)target._path._M_dataplus._M_p[2]), iVar8 == 0))
                      {
                        uVar10 = 0;
                      }
                      else {
                        uVar10 = std::__cxx11::string::find((char)(stat *)&target,0x2f);
                        if (uVar10 == 0xffffffffffffffff) {
                          uVar10 = target._path._M_string_length;
                        }
                      }
                      if ((uVar10 < target._path._M_string_length) &&
                         (target._path._M_dataplus._M_p[uVar10] == '/')) {
                        iVar8 = 5;
                        ppVar15 = (path *)std::__cxx11::string::_M_assign((string *)&local_220);
                      }
                      else {
                        iVar8 = 5;
                        ppVar15 = path::operator/=(&local_220,&target);
                      }
                    }
                    else {
                      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
                      (__return_storage_ptr__->_path)._M_string_length = 0;
                      (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
                      iVar8 = 1;
                      ppVar15 = __return_storage_ptr__;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)target._path._M_dataplus._M_p != &target._path.field_2) {
                      operator_delete(target._path._M_dataplus._M_p);
                      ppVar15 = extraout_RAX;
                    }
                    local_1d4 = (uint)CONCAT71((int7)((ulong)ppVar15 >> 8),1);
                  }
                  else {
                    iVar8 = 0;
                    path::operator/=(&local_220,&pe);
                  }
                }
                else {
                  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
                  (__return_storage_ptr__->_path)._M_string_length = 0;
                  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
                  iVar8 = 1;
                }
              }
              else {
                path::operator/=(&local_220,&pe);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pe._path._M_dataplus._M_p != paVar12) {
            operator_delete(pe._path._M_dataplus._M_p);
          }
          if ((iVar8 != 5) && (iVar8 != 0)) goto LAB_0011d5e1;
          path::iterator::operator++(&__begin3);
        }
        iVar8 = 4;
LAB_0011d5e1:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__end3._current._path._M_dataplus._M_p != &__end3._current._path.field_2) {
          operator_delete(__end3._current._path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__begin3._current._path._M_dataplus._M_p != &__begin3._current._path.field_2) {
          operator_delete(__begin3._current._path._M_dataplus._M_p);
        }
        if (iVar8 == 4) {
          iVar8 = 0;
          std::__cxx11::string::_M_assign((string *)&work);
        }
        if (iVar8 != 0) goto LAB_0011cff9;
      } while ((local_1d4 & 1) != 0);
      peVar11 = (error_category *)std::_V2::system_category();
      local_200->_M_value = 0;
      local_200->_M_cat = peVar11;
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_220 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._path._M_dataplus._M_p == paVar12) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_220._path.field_2._M_allocated_capacity._1_7_,
                      local_220._path.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) =
             local_220._path.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = local_220._path._M_dataplus._M_p;
        (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
             CONCAT71(local_220._path.field_2._M_allocated_capacity._1_7_,
                      local_220._path.field_2._M_local_buf[0]);
      }
      piVar6 = &local_220._path;
      (__return_storage_ptr__->_path)._M_string_length = local_220._path._M_string_length;
      local_220._path._M_dataplus._M_p = (pointer)paVar12;
      goto LAB_0011cfef;
    }
    peVar11 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar11;
  }
  paVar12 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar12;
  piVar6 = &__return_storage_ptr__->_path;
LAB_0011cfef:
  piVar6->_M_string_length = 0;
  paVar12->_M_local_buf[0] = '\0';
LAB_0011cff9:
  if (local_220._path._M_dataplus._M_p != (pointer)((long)&local_220 + 0x10)) {
    operator_delete(local_220._path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)work._path._M_dataplus._M_p != &work._path.field_2) {
    operator_delete(work._path._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        auto rootPathLen = work._prefixLength + work.root_name_length() + (work.has_root_directory() ? 1 : 0);
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= rootPathLen) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}